

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_ofind(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_INDEX_DATA *pOVar2;
  bool bVar3;
  char *txt;
  int iVar4;
  char arg [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_2438);
  if (local_2438[0] == '\0') {
    txt = "Find what?\n\r";
  }
  else {
    txt = "No objects by that name.\n\r";
    if (0 < top_obj_index) {
      bVar3 = false;
      iVar4 = 0;
LAB_0026ae78:
      do {
        pOVar2 = get_obj_index(0);
        if (pOVar2 != (OBJ_INDEX_DATA *)0x0) {
          iVar4 = iVar4 + 1;
          bVar1 = is_name(argument,pOVar2->name);
          if (bVar1) {
            sprintf(local_1238,"[%5d] %s\n\r",(ulong)(uint)(int)pOVar2->vnum,pOVar2->short_descr);
            send_to_char(local_1238,ch);
            bVar3 = true;
            if (top_obj_index <= iVar4) {
              return;
            }
            goto LAB_0026ae78;
          }
        }
      } while (iVar4 < top_obj_index);
      txt = "No objects by that name.\n\r";
      if (bVar3) {
        return;
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_ofind(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pObjIndex;
	int vnum;
	int nMatch;
	bool fAll;
	bool found;

	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Find what?\n\r", ch);
		return;
	}

	fAll = false; /* !str_cmp( arg, "all" ); */
	found = false;
	nMatch = 0;

	/*
	 * Yeah, so iterating over all vnum's takes 10,000 loops.
	 * Get_obj_index is fast, and I don't feel like threading another link.
	 * Do you?
	 * -- Furey
	 */
	for (vnum = 0; nMatch < top_obj_index; vnum++)
	{
		pObjIndex = get_obj_index(vnum);

		if (pObjIndex != nullptr)
		{
			nMatch++;
			if (fAll || is_name(argument, pObjIndex->name))
			{
				found = true;
				sprintf(buf, "[%5d] %s\n\r", pObjIndex->vnum, pObjIndex->short_descr);
				send_to_char(buf, ch);
			}
		}
	}

	if (!found)
		send_to_char("No objects by that name.\n\r", ch);
}